

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void av1_upsample_intra_edge_c(uint8_t *p,int sz)

{
  uint8_t uVar1;
  int in_ESI;
  long in_RDI;
  int s;
  int i_1;
  int i;
  uint8_t in [19];
  int local_30;
  int local_2c;
  byte local_28 [28];
  int local_c;
  long local_8;
  
  local_28[0] = *(byte *)(in_RDI + -1);
  local_28[1] = *(undefined1 *)(in_RDI + -1);
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < local_c; local_2c = local_2c + 1) {
    local_28[local_2c + 2] = *(byte *)(local_8 + local_2c);
  }
  local_28[local_c + 2] = *(byte *)(local_8 + (local_c + -1));
  *(byte *)(local_8 + -2) = local_28[0];
  for (local_30 = 0; local_30 < local_c; local_30 = local_30 + 1) {
    uVar1 = clip_pixel((int)(((((uint)local_28[local_30 + 1] * 9 - (uint)local_28[local_30]) +
                              (uint)local_28[local_30 + 2] * 9) - (uint)local_28[local_30 + 3]) + 8)
                       >> 4);
    *(uint8_t *)(local_8 + (local_30 * 2 + -1)) = uVar1;
    *(byte *)(local_8 + (local_30 << 1)) = local_28[local_30 + 2];
  }
  return;
}

Assistant:

void av1_upsample_intra_edge_c(uint8_t *p, int sz) {
  // interpolate half-sample positions
  assert(sz <= MAX_UPSAMPLE_SZ);

  uint8_t in[MAX_UPSAMPLE_SZ + 3];
  // copy p[-1..(sz-1)] and extend first and last samples
  in[0] = p[-1];
  in[1] = p[-1];
  for (int i = 0; i < sz; i++) {
    in[i + 2] = p[i];
  }
  in[sz + 2] = p[sz - 1];

  // interpolate half-sample edge positions
  p[-2] = in[0];
  for (int i = 0; i < sz; i++) {
    int s = -in[i] + (9 * in[i + 1]) + (9 * in[i + 2]) - in[i + 3];
    s = clip_pixel((s + 8) >> 4);
    p[2 * i - 1] = s;
    p[2 * i] = in[i + 2];
  }
}